

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_console.cpp
# Opt level: O3

void C_InitConback(void)

{
  FTextureID FVar1;
  
  FVar1 = FTextureManager::CheckForTexture(&TexMan,"CONBACK",8,1);
  conback = FVar1;
  if (FVar1.texnum < 1) {
    conback = FTextureManager::GetTexture(&TexMan,gameinfo.TitlePage.Chars,8,0);
  }
  conshade = FVar1.texnum < 1;
  conline = FVar1.texnum < 1;
  return;
}

Assistant:

void C_InitConback()
{
	conback = TexMan.CheckForTexture ("CONBACK", FTexture::TEX_MiscPatch);

	if (!conback.isValid())
	{
		conback = TexMan.GetTexture (gameinfo.TitlePage, FTexture::TEX_MiscPatch);
		conshade = MAKEARGB(175,0,0,0);
		conline = true;
	}
	else
	{
		conshade = 0;
		conline = false;
	}
}